

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-grammar-parser.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  long *plVar4;
  long *plVar5;
  undefined4 *puVar6;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *ppVar7;
  byte bVar8;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  initializer_list<llama_grammar_element> __l_00;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_01;
  initializer_list<llama_grammar_element> __l_02;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_03;
  initializer_list<llama_grammar_element> __l_04;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_05;
  initializer_list<llama_grammar_element> __l_06;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_07;
  initializer_list<llama_grammar_element> __l_08;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_09;
  initializer_list<llama_grammar_element> __l_10;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_11;
  initializer_list<llama_grammar_element> __l_12;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_13;
  initializer_list<llama_grammar_element> __l_14;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_15;
  initializer_list<llama_grammar_element> __l_16;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_17;
  initializer_list<llama_grammar_element> __l_18;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_19;
  initializer_list<llama_grammar_element> __l_20;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_21;
  initializer_list<llama_grammar_element> __l_22;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_23;
  initializer_list<llama_grammar_element> __l_24;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l_25;
  initializer_list<llama_grammar_element> __l_26;
  allocator_type local_5c2;
  allocator_type local_5c1 [9];
  vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> local_5b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_5a0;
  long *local_578 [2];
  long local_568 [2];
  undefined4 local_558;
  long *local_550 [2];
  long local_540 [2];
  undefined4 local_530;
  undefined1 *local_528 [2];
  undefined1 local_518 [16];
  undefined4 local_508;
  undefined1 *local_500 [2];
  undefined1 local_4f0 [16];
  undefined4 local_4e0;
  undefined1 *local_4d8 [2];
  undefined1 local_4c8 [16];
  undefined4 local_4b8;
  undefined1 *local_4b0 [2];
  undefined1 local_4a0 [16];
  undefined4 local_490;
  long *local_488 [2];
  long local_478 [2];
  undefined4 local_468;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_388;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_370;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_358;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_340;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_328;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_310;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_2f8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_2e0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_2c8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_2b0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_298;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_280;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_268;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_250;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_238;
  undefined8 *puStack_210;
  undefined8 local_208;
  undefined8 auStack_200 [2];
  undefined4 local_1f0;
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  undefined4 local_1c8;
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  undefined4 local_1a0;
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  undefined4 local_178;
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined4 local_150;
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined4 local_128;
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  undefined4 local_100;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined4 local_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined4 local_b0;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined4 local_88;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined4 local_60;
  long *local_58 [2];
  long local_48 [2];
  undefined4 local_38;
  
  bVar8 = 0;
  verify_failure("\n        root ::= \"a\"{,}\"\n    ");
  verify_failure("\n        root ::= \"a\"{,10}\"\n    ");
  paVar1 = &local_5a0.first.field_2;
  local_5a0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"root","");
  local_5a0.second = 0;
  __l._M_len = 1;
  __l._M_array = &local_5a0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_250,__l,local_5c1);
  local_5b8.super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x6100000003;
  local_5b8.super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_5b8;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_238,
             __l_00,&local_5c2);
  verify_parsing("\n        root  ::= \"a\"\n    ",&local_250,
                 (vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_238
                );
  if (local_238.first._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_238.first._M_dataplus._M_p,
                    local_238.first.field_2._M_allocated_capacity -
                    (long)local_238.first._M_dataplus._M_p);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_5a0.first._M_dataplus._M_p,
                    local_5a0.first.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_238.first.field_2;
  local_238.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"root","");
  local_238._32_8_ = (ulong)(uint)local_238._36_4_ << 0x20;
  __l_01._M_len = 1;
  __l_01._M_array = &local_238;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_268,__l_01,local_5c1);
  puVar6 = &DAT_001068b4;
  ppVar7 = &local_5a0;
  for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined4 *)&(ppVar7->first)._M_dataplus._M_p = *puVar6;
    puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
    ppVar7 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)((long)ppVar7 + (ulong)bVar8 * -8 + 4);
  }
  __l_02._M_len = 10;
  __l_02._M_array = (iterator)&local_5a0;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            (&local_5b8,__l_02,&local_5c2);
  verify_parsing("\n        root  ::= \"a\" | [bdx-z] | [^1-3]\n    ",&local_268,&local_5b8);
  if ((llama_grammar_element)
      local_5b8.super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>.
      _M_impl.super__Vector_impl_data._M_start != (llama_grammar_element)0x0) {
    operator_delete(local_5b8.
                    super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5b8.
                          super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5b8.
                          super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_238.first._M_dataplus._M_p,
                    local_238.first.field_2._M_allocated_capacity + 1);
  }
  local_5a0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"a","");
  local_5a0.second = 1;
  plVar5 = local_568;
  local_578[0] = plVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"root","");
  local_558 = 0;
  plVar4 = local_540;
  local_550[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_550,"root_2","");
  local_530 = 2;
  __l_03._M_len = 3;
  __l_03._M_array = &local_5a0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_280,__l_03,local_5c1);
  puVar6 = &DAT_00106904;
  ppVar7 = &local_238;
  for (lVar3 = 0x12; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined4 *)&(ppVar7->first)._M_dataplus._M_p = *puVar6;
    puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
    ppVar7 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)((long)ppVar7 + (ulong)bVar8 * -8 + 4);
  }
  __l_04._M_len = 9;
  __l_04._M_array = (iterator)&local_238;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            (&local_5b8,__l_04,&local_5c2);
  verify_parsing("\n        root  ::= a+\n        a     ::= \"a\"\n    ",&local_280,&local_5b8);
  if ((llama_grammar_element)
      local_5b8.super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>.
      _M_impl.super__Vector_impl_data._M_start != (llama_grammar_element)0x0) {
    operator_delete(local_5b8.
                    super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5b8.
                          super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5b8.
                          super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_280);
  lVar3 = -0x78;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -5;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0);
  local_5a0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"root","");
  local_5a0.second = 0;
  local_578[0] = plVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"root_1","");
  local_558 = 1;
  __l_05._M_len = 2;
  __l_05._M_array = &local_5a0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_298,__l_05,local_5c1);
  local_238.second = 2;
  local_238._36_4_ = 1;
  puStack_210 = (undefined8 *)0x1;
  local_238.first.field_2._M_allocated_capacity = 0;
  local_238.first.field_2._8_8_ = 0x6100000003;
  local_238.first._M_dataplus._M_p = (pointer)0x6100000003;
  local_238.first._M_string_length = 0x100000002;
  local_208 = 0;
  __l_06._M_len = 7;
  __l_06._M_array = (iterator)&local_238;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            (&local_5b8,__l_06,&local_5c2);
  verify_parsing("\n        root  ::= \"a\"+\n    ",&local_298,&local_5b8);
  if ((llama_grammar_element)
      local_5b8.super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>.
      _M_impl.super__Vector_impl_data._M_start != (llama_grammar_element)0x0) {
    operator_delete(local_5b8.
                    super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5b8.
                          super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5b8.
                          super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_298);
  lVar3 = -0x50;
  do {
    if (plVar5 != (long *)plVar5[-2]) {
      operator_delete((long *)plVar5[-2],*plVar5 + 1);
    }
    plVar5 = plVar5 + -5;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0);
  local_5a0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"a","");
  local_5a0.second = 1;
  plVar5 = local_568;
  local_578[0] = plVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"root","");
  local_558 = 0;
  plVar4 = local_540;
  local_550[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_550,"root_2","");
  local_530 = 2;
  __l_07._M_len = 3;
  __l_07._M_array = &local_5a0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_2b0,__l_07,local_5c1);
  local_238.second = 2;
  local_238._36_4_ = 1;
  puStack_210 = (undefined8 *)0x1;
  local_238.first.field_2._M_allocated_capacity = 0x6100000003;
  local_238.first.field_2._8_8_ = 0;
  local_238.first._M_dataplus._M_p = (pointer)0x200000002;
  local_238.first._M_string_length = 0;
  local_208 = 0;
  __l_08._M_len = 7;
  __l_08._M_array = (iterator)&local_238;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            (&local_5b8,__l_08,&local_5c2);
  verify_parsing("\n        root  ::= a?\n        a     ::= \"a\"\n    ",&local_2b0,&local_5b8);
  if ((llama_grammar_element)
      local_5b8.super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>.
      _M_impl.super__Vector_impl_data._M_start != (llama_grammar_element)0x0) {
    operator_delete(local_5b8.
                    super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5b8.
                          super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5b8.
                          super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_2b0);
  lVar3 = -0x78;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -5;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0);
  local_5a0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"root","");
  local_5a0.second = 0;
  local_578[0] = plVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"root_1","");
  local_558 = 1;
  __l_09._M_len = 2;
  __l_09._M_array = &local_5a0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_2c8,__l_09,local_5c1);
  local_238.first.field_2._M_allocated_capacity = 0x6100000003;
  local_238.first.field_2._8_8_ = 1;
  local_238.first._M_dataplus._M_p = (pointer)0x100000002;
  local_238.first._M_string_length = 0;
  local_238.second = 0;
  local_238._36_4_ = 0;
  __l_10._M_len = 5;
  __l_10._M_array = (iterator)&local_238;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            (&local_5b8,__l_10,&local_5c2);
  verify_parsing("\n        root  ::= \"a\"?\n    ",&local_2c8,&local_5b8);
  if ((llama_grammar_element)
      local_5b8.super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>.
      _M_impl.super__Vector_impl_data._M_start != (llama_grammar_element)0x0) {
    operator_delete(local_5b8.
                    super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5b8.
                          super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5b8.
                          super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_2c8);
  lVar3 = -0x50;
  do {
    if (plVar5 != (long *)plVar5[-2]) {
      operator_delete((long *)plVar5[-2],*plVar5 + 1);
    }
    plVar5 = plVar5 + -5;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0);
  local_5a0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"a","");
  local_5a0.second = 1;
  plVar5 = local_568;
  local_578[0] = plVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"root","");
  local_558 = 0;
  plVar4 = local_540;
  local_550[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_550,"root_2","");
  local_530 = 2;
  __l_11._M_len = 3;
  __l_11._M_array = &local_5a0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_2e0,__l_11,local_5c1);
  local_208 = 1;
  auStack_200[0] = 0;
  local_238.second = 2;
  local_238._36_4_ = 1;
  puStack_210 = (undefined8 *)0x200000002;
  local_238.first.field_2._M_allocated_capacity = 0x6100000003;
  local_238.first.field_2._8_8_ = 0;
  local_238.first._M_dataplus._M_p = (pointer)0x200000002;
  local_238.first._M_string_length = 0;
  __l_12._M_len = 8;
  __l_12._M_array = (iterator)&local_238;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            (&local_5b8,__l_12,&local_5c2);
  verify_parsing("\n        root  ::= a*\n        a     ::= \"a\"\n    ",&local_2e0,&local_5b8);
  if ((llama_grammar_element)
      local_5b8.super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>.
      _M_impl.super__Vector_impl_data._M_start != (llama_grammar_element)0x0) {
    operator_delete(local_5b8.
                    super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5b8.
                          super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5b8.
                          super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_2e0);
  lVar3 = -0x78;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -5;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0);
  local_5a0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"root","");
  local_5a0.second = 0;
  local_578[0] = plVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"root_1","");
  local_558 = 1;
  __l_13._M_len = 2;
  __l_13._M_array = &local_5a0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_2f8,__l_13,local_5c1);
  local_238.second = 1;
  local_238._36_4_ = 0;
  puStack_210 = (undefined8 *)0x0;
  local_238.first.field_2._M_allocated_capacity = 0x6100000003;
  local_238.first.field_2._8_8_ = 0x100000002;
  local_238.first._M_dataplus._M_p = (pointer)0x100000002;
  local_238.first._M_string_length = 0;
  __l_14._M_len = 6;
  __l_14._M_array = (iterator)&local_238;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            (&local_5b8,__l_14,&local_5c2);
  verify_parsing("\n        root  ::= \"a\"*\n    ",&local_2f8,&local_5b8);
  if ((llama_grammar_element)
      local_5b8.super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>.
      _M_impl.super__Vector_impl_data._M_start != (llama_grammar_element)0x0) {
    operator_delete(local_5b8.
                    super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5b8.
                          super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5b8.
                          super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_2f8);
  lVar3 = -0x50;
  do {
    if (plVar5 != (long *)plVar5[-2]) {
      operator_delete((long *)plVar5[-2],*plVar5 + 1);
    }
    plVar5 = plVar5 + -5;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0);
  local_5a0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"root","");
  local_5a0.second = 0;
  __l_15._M_len = 1;
  __l_15._M_array = &local_5a0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_310,__l_15,local_5c1);
  local_5b8.super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x6100000003;
  local_5b8.super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x6100000003;
  local_5b8.super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __l_16._M_len = 3;
  __l_16._M_array = (iterator)&local_5b8;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_238,
             __l_16,&local_5c2);
  verify_parsing("\n        root  ::= \"a\"{2}\n    ",&local_310,
                 (vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)&local_238
                );
  if (local_238.first._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_238.first._M_dataplus._M_p,
                    local_238.first.field_2._M_allocated_capacity -
                    (long)local_238.first._M_dataplus._M_p);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_5a0.first._M_dataplus._M_p,
                    local_5a0.first.field_2._M_allocated_capacity + 1);
  }
  local_5a0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"root","");
  local_5a0.second = 0;
  plVar5 = local_568;
  local_578[0] = plVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"root_1","");
  local_558 = 1;
  __l_17._M_len = 2;
  __l_17._M_array = &local_5a0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_328,__l_17,local_5c1);
  local_208 = 1;
  auStack_200[0] = 0;
  local_238.second = 3;
  local_238._36_4_ = 0x61;
  puStack_210 = (undefined8 *)0x100000002;
  local_238.first.field_2._M_allocated_capacity = 0x100000002;
  local_238.first.field_2._8_8_ = 0;
  local_238.first._M_dataplus._M_p = (pointer)0x6100000003;
  local_238.first._M_string_length = 0x6100000003;
  __l_18._M_len = 8;
  __l_18._M_array = (iterator)&local_238;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            (&local_5b8,__l_18,&local_5c2);
  verify_parsing("\n        root  ::= \"a\"{2,}\n    ",&local_328,&local_5b8);
  if ((llama_grammar_element)
      local_5b8.super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>.
      _M_impl.super__Vector_impl_data._M_start != (llama_grammar_element)0x0) {
    operator_delete(local_5b8.
                    super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5b8.
                          super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5b8.
                          super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_328);
  lVar3 = -0x50;
  do {
    if (plVar5 != (long *)plVar5[-2]) {
      operator_delete((long *)plVar5[-2],*plVar5 + 1);
    }
    plVar5 = plVar5 + -5;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0);
  local_5a0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"root","");
  local_5a0.second = 0;
  __l_19._M_len = 1;
  __l_19._M_array = &local_5a0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_340,__l_19,local_5c1);
  local_238.first.field_2._M_allocated_capacity = 0x6100000003;
  local_238.first.field_2._8_8_ = 0x6100000003;
  local_238.first._M_dataplus._M_p = (pointer)0x6100000003;
  local_238.first._M_string_length = 0x6100000003;
  local_238.second = 0;
  local_238._36_4_ = 0;
  __l_20._M_len = 5;
  __l_20._M_array = (iterator)&local_238;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            (&local_5b8,__l_20,&local_5c2);
  verify_parsing("\n        root  ::= \"a\"{ 4}\n    ",&local_340,&local_5b8);
  if ((llama_grammar_element)
      local_5b8.super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>.
      _M_impl.super__Vector_impl_data._M_start != (llama_grammar_element)0x0) {
    operator_delete(local_5b8.
                    super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5b8.
                          super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5b8.
                          super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_5a0.first._M_dataplus._M_p,
                    local_5a0.first.field_2._M_allocated_capacity + 1);
  }
  local_5a0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"root","");
  local_5a0.second = 0;
  local_578[0] = local_568;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"root_1","");
  local_558 = 1;
  plVar5 = local_540;
  local_550[0] = plVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_550,"root_2","");
  local_530 = 2;
  __l_21._M_len = 3;
  __l_21._M_array = &local_5a0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_358,__l_21,local_5c1);
  puVar6 = &DAT_00106ad4;
  ppVar7 = &local_238;
  for (lVar3 = 0x16; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined4 *)&(ppVar7->first)._M_dataplus._M_p = *puVar6;
    puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
    ppVar7 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)((long)ppVar7 + (ulong)bVar8 * -8 + 4);
  }
  __l_22._M_len = 0xb;
  __l_22._M_array = (iterator)&local_238;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            (&local_5b8,__l_22,&local_5c2);
  verify_parsing("\n        root  ::= \"a\"{2,4}\n    ",&local_358,&local_5b8);
  if ((llama_grammar_element)
      local_5b8.super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>.
      _M_impl.super__Vector_impl_data._M_start != (llama_grammar_element)0x0) {
    operator_delete(local_5b8.
                    super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5b8.
                          super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5b8.
                          super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_358);
  lVar3 = -0x78;
  do {
    if (plVar5 != (long *)plVar5[-2]) {
      operator_delete((long *)plVar5[-2],*plVar5 + 1);
    }
    plVar5 = plVar5 + -5;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0);
  local_5a0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"expr","");
  local_5a0.second = 2;
  local_578[0] = local_568;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"expr_5","");
  local_558 = 5;
  local_550[0] = local_540;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_550,"expr_6","");
  local_530 = 6;
  local_528[0] = local_518;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"root","");
  local_508 = 0;
  local_500[0] = local_4f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"root_1","");
  local_4e0 = 1;
  local_4d8[0] = local_4c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"root_4","");
  local_4b8 = 4;
  local_4b0[0] = local_4a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"term","");
  local_490 = 3;
  plVar5 = local_478;
  local_488[0] = plVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"term_7","");
  local_468 = 7;
  __l_23._M_len = 8;
  __l_23._M_array = &local_5a0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_370,__l_23,local_5c1);
  memcpy(&local_238,&DAT_00106b2c,0x110);
  __l_24._M_len = 0x22;
  __l_24._M_array = (iterator)&local_238;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            (&local_5b8,__l_24,&local_5c2);
  verify_parsing("\n        root  ::= (expr \"=\" term \"\\n\")+\n        expr  ::= term ([-+*/] term)*\n        term  ::= [0-9]+\n    "
                 ,&local_370,&local_5b8);
  if ((llama_grammar_element)
      local_5b8.super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>.
      _M_impl.super__Vector_impl_data._M_start != (llama_grammar_element)0x0) {
    operator_delete(local_5b8.
                    super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5b8.
                          super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5b8.
                          super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_370);
  lVar3 = -0x140;
  do {
    if (plVar5 != (long *)plVar5[-2]) {
      operator_delete((long *)plVar5[-2],*plVar5 + 1);
    }
    plVar5 = plVar5 + -5;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0);
  local_238.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"expr","");
  local_238.second = 2;
  puStack_210 = auStack_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&puStack_210,"expr_6","");
  local_1f0 = 6;
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"expr_7","");
  local_1c8 = 7;
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"ident","");
  local_1a0 = 8;
  local_198[0] = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"ident_10","");
  local_178 = 10;
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"num","");
  local_150 = 9;
  local_148[0] = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"num_11","");
  local_128 = 0xb;
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"root","");
  local_100 = 0;
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"root_1","");
  local_d8 = 1;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"root_5","");
  local_b0 = 5;
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"term","");
  local_88 = 4;
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"ws","");
  local_60 = 3;
  plVar5 = local_48;
  local_58[0] = plVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"ws_12","");
  local_38 = 0xc;
  __l_25._M_len = 0xd;
  __l_25._M_array = &local_238;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(&local_388,__l_25,local_5c1);
  memcpy(&local_5a0,&DAT_00106c3c,0x218);
  __l_26._M_len = 0x43;
  __l_26._M_array = (iterator)&local_5a0;
  std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::vector
            (&local_5b8,__l_26,&local_5c2);
  verify_parsing("\n        root  ::= (expr \"=\" ws term \"\\n\")+\n        expr  ::= term ([-+*/] term)*\n        term  ::= ident | num | \"(\" ws expr \")\" ws\n        ident ::= [a-z] [a-z0-9_]* ws\n        num   ::= [0-9]+ ws\n        ws    ::= [ \\t\\n]*\n    "
                 ,&local_388,&local_5b8);
  if ((llama_grammar_element)
      local_5b8.super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>.
      _M_impl.super__Vector_impl_data._M_start != (llama_grammar_element)0x0) {
    operator_delete(local_5b8.
                    super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5b8.
                          super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5b8.
                          super__Vector_base<llama_grammar_element,_std::allocator<llama_grammar_element>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(&local_388);
  lVar3 = -0x208;
  do {
    if (plVar5 != (long *)plVar5[-2]) {
      operator_delete((long *)plVar5[-2],*plVar5 + 1);
    }
    plVar5 = plVar5 + -5;
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0);
  return 0;
}

Assistant:

int main()
{
    verify_failure(R"""(
        root ::= "a"{,}"
    )""");

    verify_failure(R"""(
        root ::= "a"{,10}"
    )""");

    verify_parsing(R"""(
        root  ::= "a"
    )""", {
        {"root", 0},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= "a" | [bdx-z] | [^1-3]
    )""", {
        {"root", 0},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_CHAR, 'b'},
        {LLAMA_GRETYPE_CHAR_ALT, 'd'},
        {LLAMA_GRETYPE_CHAR_ALT, 'x'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, 'z'},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_CHAR_NOT, '1'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, '3'},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= a+
        a     ::= "a"
    )""", {
        {"a", 1},
        {"root", 0},
        {"root_2", 2},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_RULE_REF, /* a */ 1},
        {LLAMA_GRETYPE_RULE_REF, /* root_2 */ 2},
        {LLAMA_GRETYPE_END, 0},
        // a (index 1)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_END, 0},
        // root_2 (index 2)
        {LLAMA_GRETYPE_RULE_REF, /* a */ 1},
        {LLAMA_GRETYPE_RULE_REF, /* root_2 */ 2},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= "a"+
    )""", {
        {"root", 0},
        {"root_1", 1},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_END, 0},
        // root_1 (index 1)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= a?
        a     ::= "a"
    )""", {
        {"a", 1},
        {"root", 0},
        {"root_2", 2},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_RULE_REF, /* root_2 */ 2},
        {LLAMA_GRETYPE_END, 0},
        // a (index 1)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_END, 0},
        // root_2 (index 2)
        {LLAMA_GRETYPE_RULE_REF, /* a */ 1},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= "a"?
    )""", {
        {"root", 0},
        {"root_1", 1},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_END, 0},
        // root_1 (index 1)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= a*
        a     ::= "a"
    )""", {
        {"a", 1},
        {"root", 0},
        {"root_2", 2},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_RULE_REF, /* root_2 */ 2},
        {LLAMA_GRETYPE_END, 0},
        // a (index 1)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_END, 0},
        // root_2 (index 2)
        {LLAMA_GRETYPE_RULE_REF, /* a */ 1},
        {LLAMA_GRETYPE_RULE_REF, /* root_2 */ 2},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= "a"*
    )""", {
        {"root", 0},
        {"root_1", 1},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_END, 0},
        // root_1 (index 1)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= "a"{2}
    )""", {
        {"root", 0},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= "a"{2,}
    )""", {
        {"root", 0},
        {"root_1", 1},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_END, 0},
        // root_1 (index 1)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= "a"{ 4}
    )""", {
        {"root", 0},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= "a"{2,4}
    )""", {
        {"root", 0},
        {"root_1", 1},
        {"root_2", 2},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_RULE_REF, /* root_2 */ 2},
        {LLAMA_GRETYPE_END, 0},
        // root_1 (index 1)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
        // root_2 (index 2)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= (expr "=" term "\n")+
        expr  ::= term ([-+*/] term)*
        term  ::= [0-9]+
    )""", {
        {"expr", 2},
        {"expr_5", 5},
        {"expr_6", 6},
        {"root", 0},
        {"root_1", 1},
        {"root_4", 4},
        {"term", 3},
        {"term_7", 7},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_RULE_REF, /* root_4 */ 4},
        {LLAMA_GRETYPE_END, 0},
        // root_1 (index 1)
        {LLAMA_GRETYPE_RULE_REF, /* expr */ 2},
        {LLAMA_GRETYPE_CHAR, '='},
        {LLAMA_GRETYPE_RULE_REF, /* term */ 3},
        {LLAMA_GRETYPE_CHAR, '\n'},
        {LLAMA_GRETYPE_END, 0},
        // expr (index 2)
        {LLAMA_GRETYPE_RULE_REF, /* term */ 3},
        {LLAMA_GRETYPE_RULE_REF, /* expr_6 */ 6},
        {LLAMA_GRETYPE_END, 0},
        // term (index 3)
        {LLAMA_GRETYPE_CHAR, '0'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, '9'},
        {LLAMA_GRETYPE_RULE_REF, /* term_7 */ 7},
        {LLAMA_GRETYPE_END, 0},
        // root_4 (index 4)
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_RULE_REF, /* root_4 */ 4},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
        // expr_5 (index 5)
        {LLAMA_GRETYPE_CHAR, '-'},
        {LLAMA_GRETYPE_CHAR_ALT, '+'},
        {LLAMA_GRETYPE_CHAR_ALT, '*'},
        {LLAMA_GRETYPE_CHAR_ALT, '/'},
        {LLAMA_GRETYPE_RULE_REF, /* term */ 3},
        {LLAMA_GRETYPE_END, 0},
        // expr_6 (index 6)
        {LLAMA_GRETYPE_RULE_REF, /* expr_5 */ 5},
        {LLAMA_GRETYPE_RULE_REF, /* expr_6 */ 6},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
        // term_7 (index 7)
        {LLAMA_GRETYPE_CHAR, '0'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, '9'},
        {LLAMA_GRETYPE_RULE_REF, /* term_7 */ 7},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    verify_parsing(R"""(
        root  ::= (expr "=" ws term "\n")+
        expr  ::= term ([-+*/] term)*
        term  ::= ident | num | "(" ws expr ")" ws
        ident ::= [a-z] [a-z0-9_]* ws
        num   ::= [0-9]+ ws
        ws    ::= [ \t\n]*
    )""", {
        {"expr", 2},
        {"expr_6", 6},
        {"expr_7", 7},
        {"ident", 8},
        {"ident_10", 10},
        {"num", 9},
        {"num_11", 11},
        {"root", 0},
        {"root_1", 1},
        {"root_5", 5},
        {"term", 4},
        {"ws", 3},
        {"ws_12", 12},
    }, {
        // root (index 0)
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_RULE_REF, /* root_5 */ 5},
        {LLAMA_GRETYPE_END, 0},
        // root_1 (index 1)
        {LLAMA_GRETYPE_RULE_REF, /* expr */ 2},
        {LLAMA_GRETYPE_CHAR, '='},
        {LLAMA_GRETYPE_RULE_REF, /* ws */ 3},
        {LLAMA_GRETYPE_RULE_REF, /* term */ 4},
        {LLAMA_GRETYPE_CHAR, '\n'},
        {LLAMA_GRETYPE_END, 0},
        // expr (index 2)
        {LLAMA_GRETYPE_RULE_REF, /* term */ 4},
        {LLAMA_GRETYPE_RULE_REF, /* expr_7 */ 7},
        {LLAMA_GRETYPE_END, 0},
        // ws (index 3)
        {LLAMA_GRETYPE_RULE_REF, /* ws_12 */ 12},
        {LLAMA_GRETYPE_END, 0},
        // term (index 4)
        {LLAMA_GRETYPE_RULE_REF, /* ident */ 8},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_RULE_REF, /* num */ 9},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_CHAR, '('},
        {LLAMA_GRETYPE_RULE_REF, /* ws */ 3},
        {LLAMA_GRETYPE_RULE_REF, /* expr */ 2},
        {LLAMA_GRETYPE_CHAR, ')'},
        {LLAMA_GRETYPE_RULE_REF, /* ws */ 3},
        {LLAMA_GRETYPE_END, 0},
        // root_5 (index 5)
        {LLAMA_GRETYPE_RULE_REF, /* root_1 */ 1},
        {LLAMA_GRETYPE_RULE_REF, /* root_5 */ 5},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
        // expr_6 (index 6)
        {LLAMA_GRETYPE_CHAR, '-'},
        {LLAMA_GRETYPE_CHAR_ALT, '+'},
        {LLAMA_GRETYPE_CHAR_ALT, '*'},
        {LLAMA_GRETYPE_CHAR_ALT, '/'},
        {LLAMA_GRETYPE_RULE_REF, /* term */ 4},
        {LLAMA_GRETYPE_END, 0},
        // expr_7 (index 7)
        {LLAMA_GRETYPE_RULE_REF, /* expr_6 */ 6},
        {LLAMA_GRETYPE_RULE_REF, /* expr_7 */ 7},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
        // ident (index 8)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, 'z'},
        {LLAMA_GRETYPE_RULE_REF, /* ident_10 */ 10},
        {LLAMA_GRETYPE_RULE_REF, /* ws */ 3},
        {LLAMA_GRETYPE_END, 0},
        // num (index 9)
        {LLAMA_GRETYPE_CHAR, '0'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, '9'},
        {LLAMA_GRETYPE_RULE_REF, /* num_11 */ 11},
        {LLAMA_GRETYPE_RULE_REF, /* ws */ 3},
        {LLAMA_GRETYPE_END, 0},
        // ident_10 (index 10)
        {LLAMA_GRETYPE_CHAR, 'a'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, 'z'},
        {LLAMA_GRETYPE_CHAR_ALT, '0'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, '9'},
        {LLAMA_GRETYPE_CHAR_ALT, '_'},
        {LLAMA_GRETYPE_RULE_REF, /* ident_10 */ 10},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
        // num_11 (index 11)
        {LLAMA_GRETYPE_CHAR, '0'},
        {LLAMA_GRETYPE_CHAR_RNG_UPPER, '9'},
        {LLAMA_GRETYPE_RULE_REF, /* num_11 */ 11},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
        // ws_12 (index 12)
        {LLAMA_GRETYPE_CHAR, ' '},
        {LLAMA_GRETYPE_CHAR_ALT, '\t'},
        {LLAMA_GRETYPE_CHAR_ALT, '\n'},
        {LLAMA_GRETYPE_RULE_REF, /* ws_12 */ 12},
        {LLAMA_GRETYPE_ALT, 0},
        {LLAMA_GRETYPE_END, 0},
    });

    return 0;
}